

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::MILSpec::TensorValue::clear_value(TensorValue *this)

{
  TensorValue_RepeatedFloats *this_00;
  TensorValue_RepeatedInts *this_01;
  TensorValue_RepeatedBools *this_02;
  TensorValue_RepeatedStrings *this_03;
  TensorValue_RepeatedLongInts *this_04;
  TensorValue_RepeatedDoubles *this_05;
  TensorValue_RepeatedBytes *this_06;
  ValueCase VVar1;
  Arena *pAVar2;
  TensorValue *this_local;
  
  VVar1 = value_case(this);
  switch(VVar1) {
  case VALUE_NOT_SET:
    break;
  case kFloats:
    pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    if ((pAVar2 == (Arena *)0x0) &&
       (this_00 = (this->value_).floats_, this_00 != (TensorValue_RepeatedFloats *)0x0)) {
      TensorValue_RepeatedFloats::~TensorValue_RepeatedFloats(this_00);
      operator_delete(this_00,0x28);
    }
    break;
  case kInts:
    pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    if ((pAVar2 == (Arena *)0x0) &&
       (this_01 = (this->value_).ints_, this_01 != (TensorValue_RepeatedInts *)0x0)) {
      TensorValue_RepeatedInts::~TensorValue_RepeatedInts(this_01);
      operator_delete(this_01,0x28);
    }
    break;
  case kBools:
    pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    if ((pAVar2 == (Arena *)0x0) &&
       (this_02 = (this->value_).bools_, this_02 != (TensorValue_RepeatedBools *)0x0)) {
      TensorValue_RepeatedBools::~TensorValue_RepeatedBools(this_02);
      operator_delete(this_02,0x28);
    }
    break;
  case kStrings:
    pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    if ((pAVar2 == (Arena *)0x0) &&
       (this_03 = (this->value_).strings_, this_03 != (TensorValue_RepeatedStrings *)0x0)) {
      TensorValue_RepeatedStrings::~TensorValue_RepeatedStrings(this_03);
      operator_delete(this_03,0x30);
    }
    break;
  case kLongInts:
    pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    if ((pAVar2 == (Arena *)0x0) &&
       (this_04 = (this->value_).longints_, this_04 != (TensorValue_RepeatedLongInts *)0x0)) {
      TensorValue_RepeatedLongInts::~TensorValue_RepeatedLongInts(this_04);
      operator_delete(this_04,0x28);
    }
    break;
  case kDoubles:
    pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    if ((pAVar2 == (Arena *)0x0) &&
       (this_05 = (this->value_).doubles_, this_05 != (TensorValue_RepeatedDoubles *)0x0)) {
      TensorValue_RepeatedDoubles::~TensorValue_RepeatedDoubles(this_05);
      operator_delete(this_05,0x28);
    }
    break;
  case kBytes:
    pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    if ((pAVar2 == (Arena *)0x0) &&
       (this_06 = (this->value_).bytes_, this_06 != (TensorValue_RepeatedBytes *)0x0)) {
      TensorValue_RepeatedBytes::~TensorValue_RepeatedBytes(this_06);
      operator_delete(this_06,0x20);
    }
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void TensorValue::clear_value() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.MILSpec.TensorValue)
  switch (value_case()) {
    case kFloats: {
      if (GetArenaForAllocation() == nullptr) {
        delete value_.floats_;
      }
      break;
    }
    case kInts: {
      if (GetArenaForAllocation() == nullptr) {
        delete value_.ints_;
      }
      break;
    }
    case kBools: {
      if (GetArenaForAllocation() == nullptr) {
        delete value_.bools_;
      }
      break;
    }
    case kStrings: {
      if (GetArenaForAllocation() == nullptr) {
        delete value_.strings_;
      }
      break;
    }
    case kLongInts: {
      if (GetArenaForAllocation() == nullptr) {
        delete value_.longints_;
      }
      break;
    }
    case kDoubles: {
      if (GetArenaForAllocation() == nullptr) {
        delete value_.doubles_;
      }
      break;
    }
    case kBytes: {
      if (GetArenaForAllocation() == nullptr) {
        delete value_.bytes_;
      }
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = VALUE_NOT_SET;
}